

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_132b90d::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  string *psVar7;
  cmGlobalGenerator *this;
  int iVar8;
  ulong uVar9;
  pointer pbVar10;
  pointer __args_1;
  bool bVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  bool all_components;
  bool exclude_from_all;
  string script;
  string component;
  Helper helper;
  undefined1 local_146;
  bool local_145;
  uint local_144;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  long local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  size_type local_120;
  pointer local_118;
  cmExecutionStatus *local_110;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_108;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_100;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_88;
  string local_80;
  Helper local_60;
  
  local_110 = status;
  Helper::Helper(&local_60,status);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_60.DefaultComponentName._M_dataplus._M_p,
             local_60.DefaultComponentName._M_dataplus._M_p +
             local_60.DefaultComponentName._M_string_length);
  iVar8 = 0;
  local_145 = false;
  local_146 = '\0';
  __args_1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != __args_1) {
    uVar9 = 0;
    iVar8 = 0;
    do {
      iVar5 = std::__cxx11::string::compare((char *)(__args_1 + uVar9));
      if ((iVar5 == 0) &&
         (uVar9 + 1 <
          (ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&local_d8);
        iVar8 = iVar8 + 1;
        uVar9 = uVar9 + 1;
      }
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9));
      if (iVar5 == 0) {
        local_145 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9));
        if (iVar5 == 0) {
          local_146 = '\x01';
        }
      }
      uVar9 = uVar9 + 1;
      __args_1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar9 < (ulong)((long)pbVar10 - (long)__args_1 >> 5));
  }
  if (iVar8 < 2) {
    if ((iVar8 == 1) && (local_146 != '\0')) {
      local_140._M_len = (size_t)&local_130;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"ALL_COMPONENTS and COMPONENT are mutually exclusive","");
      std::__cxx11::string::_M_assign((string *)&local_110->Error);
      goto LAB_0038ddef;
    }
    bVar11 = __args_1 == pbVar10;
    if (bVar11) {
      bVar3 = false;
      local_144 = 0;
    }
    else {
      local_88 = (string *)&local_110->Error;
      local_144 = 0;
      bVar3 = false;
      do {
        iVar8 = std::__cxx11::string::compare((char *)__args_1);
        if (iVar8 == 0) {
          bVar3 = true;
          local_144 = 0;
          bVar4 = true;
        }
        else {
          uVar6 = std::__cxx11::string::compare((char *)__args_1);
          bVar4 = true;
          if ((int)uVar6 == 0) {
            bVar3 = false;
            local_144 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)__args_1);
            pcVar2 = local_60.Makefile;
            if (iVar8 == 0) {
              bVar3 = false;
LAB_0038e117:
              local_144 = 0;
            }
            else if (bVar3) {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              pcVar1 = (__args_1->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f8,pcVar1,pcVar1 + __args_1->_M_string_length);
              bVar3 = cmsys::SystemTools::FileIsFullPath(&local_f8);
              if (!bVar3) {
                psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_60.Makefile);
                local_140._M_str = (psVar7->_M_dataplus)._M_p;
                local_140._M_len = psVar7->_M_string_length;
                local_b8._M_dataplus._M_p = &DAT_00000001;
                local_128 = &local_b8.field_2;
                local_b8.field_2._M_local_buf[0] = '/';
                local_130 = 1;
                local_118 = (__args_1->_M_dataplus)._M_p;
                local_120 = __args_1->_M_string_length;
                views._M_len = 3;
                views._M_array = &local_140;
                local_b8._M_string_length = (size_type)local_128;
                cmCatViews_abi_cxx11_(&local_80,views);
                std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_80);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
                    &local_80.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                           local_80._M_dataplus._M_p._0_1_),
                                  local_80.field_2._M_allocated_capacity + 1);
                }
              }
              bVar4 = cmsys::SystemTools::FileIsDirectory(&local_f8);
              pcVar2 = local_60.Makefile;
              if (bVar4) {
                local_140._M_len = (size_t)&local_130;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_140,"given a directory as value of SCRIPT argument.","")
                ;
                std::__cxx11::string::_M_assign(local_88);
                if ((long *)local_140._M_len != &local_130) {
                  operator_delete((void *)local_140._M_len,local_130 + 1);
                }
              }
              else {
                local_80._M_dataplus._M_p._0_1_ = 0;
                cmMakefile::GetBacktrace(local_60.Makefile);
                std::
                make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                          (&local_b8,(bool *)&local_f8,&local_80,(bool *)&local_d8,&local_145,
                           (cmListFileBacktrace *)&local_146);
                local_100._M_head_impl = (cmInstallGenerator *)local_b8._M_dataplus._M_p;
                local_b8._M_dataplus._M_p = (pointer)0x0;
                cmMakefile::AddInstallGenerator
                          (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                   *)&local_100);
                if (local_100._M_head_impl != (cmInstallGenerator *)0x0) {
                  (*((local_100._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])
                            ();
                }
                local_100._M_head_impl = (cmInstallGenerator *)0x0;
                if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
                  (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
                }
                local_b8._M_dataplus._M_p = (pointer)0x0;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar4 = !bVar4;
              bVar3 = false;
            }
            else if ((local_144 & 1) != 0) {
              local_f8._M_dataplus._M_p._0_1_ = 1;
              cmMakefile::GetBacktrace(local_60.Makefile);
              std::
              make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                        (&local_b8,(bool *)__args_1,&local_f8,(bool *)&local_d8,&local_145,
                         (cmListFileBacktrace *)&local_146);
              local_108._M_head_impl = (cmInstallGenerator *)local_b8._M_dataplus._M_p;
              local_b8._M_dataplus._M_p = (pointer)0x0;
              cmMakefile::AddInstallGenerator
                        (pcVar2,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                 *)&local_108);
              if (local_108._M_head_impl != (cmInstallGenerator *)0x0) {
                (*((local_108._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
              }
              local_108._M_head_impl = (cmInstallGenerator *)0x0;
              if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
              }
              local_b8._M_dataplus._M_p = (pointer)0x0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_str);
              }
              goto LAB_0038e117;
            }
          }
        }
        if (!bVar4) break;
        __args_1 = __args_1 + 1;
        bVar11 = __args_1 == pbVar10;
      } while (!bVar11);
    }
    if (bVar11) {
      if (bVar3) {
        local_140._M_len = (size_t)&local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"given no value for SCRIPT argument.","");
        std::__cxx11::string::_M_assign((string *)&local_110->Error);
      }
      else {
        if ((local_144 & 1) == 0) {
          this = cmMakefile::GetGlobalGenerator(local_60.Makefile);
          bVar11 = true;
          cmGlobalGenerator::AddInstallComponent(this,&local_d8);
          goto LAB_0038de08;
        }
        local_140._M_len = (size_t)&local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"given no value for CODE argument.","");
        std::__cxx11::string::_M_assign((string *)&local_110->Error);
      }
      goto LAB_0038ddef;
    }
  }
  else {
    local_140._M_len = (size_t)&local_130;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,"");
    std::__cxx11::string::_M_assign((string *)&local_110->Error);
LAB_0038ddef:
    if ((long *)local_140._M_len != &local_130) {
      operator_delete((void *)local_140._M_len,local_130 + 1);
    }
  }
  bVar11 = false;
LAB_0038de08:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.DefaultComponentName._M_dataplus._M_p != &local_60.DefaultComponentName.field_2) {
    operator_delete(local_60.DefaultComponentName._M_dataplus._M_p,
                    local_60.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmSystemTools::FileIsFullPath(script)) {
        script =
          cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
      }
      if (cmSystemTools::FileIsDirectory(script)) {
        status.SetError("given a directory as value of SCRIPT argument.");
        return false;
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}